

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O0

void __thiscall QScrollbarStyleAnimation::updateCurrentTime(QScrollbarStyleAnimation *this,int time)

{
  long lVar1;
  bool bVar2;
  QObject *name;
  int in_ESI;
  QStyleAnimation *in_RDI;
  long in_FS_OFFSET;
  double in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QStyleAnimation::updateCurrentTime(in_RDI,in_ESI);
  if (in_RDI[1]._startTime.mds == 1) {
    QNumberStyleAnimation::currentValue((QNumberStyleAnimation *)in_stack_ffffffffffffffd8);
    bVar2 = qFuzzyIsNull(in_stack_ffffffffffffffb8);
    if (bVar2) {
      name = QStyleAnimation::target((QStyleAnimation *)0x4c706c);
      ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffd8,false);
      QObject::setProperty((QObject *)in_RDI,(char *)name,(QVariant *)0x4c7091);
      ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollbarStyleAnimation::updateCurrentTime(int time)
{
    QNumberStyleAnimation::updateCurrentTime(time);
    if (_mode == Deactivating && qFuzzyIsNull(currentValue()))
        target()->setProperty("visible", false);
}